

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucitest.cc
# Opt level: O0

void __thiscall UciTest_parseMovesA2A3A7A6_Test::TestBody(UciTest_parseMovesA2A3A7A6_Test *this)

{
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l;
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l_00;
  allocator<std::pair<const_board::Square,_board::Piece>_> local_12a;
  less<board::Square> local_129;
  Piece local_128;
  Square local_124;
  Piece local_120;
  Square local_11c;
  pair<const_board::Square,_board::Piece> local_118;
  pair<const_board::Square,_board::Piece> local_110;
  pair<const_board::Square,_board::Piece> *local_108;
  size_type local_100;
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  local_f8;
  allocator<char> local_c1;
  string local_c0;
  allocator<std::pair<const_board::Square,_board::Piece>_> local_9a;
  less<board::Square> local_99;
  Piece local_98;
  Square local_94;
  pair<const_board::Square,_board::Piece> local_90;
  pair<const_board::Square,_board::Piece> *local_88;
  size_type local_80;
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  local_78;
  allocator<char> local_31;
  string local_30;
  UciTest_parseMovesA2A3A7A6_Test *local_10;
  UciTest_parseMovesA2A3A7A6_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"moves a2a3",&local_31);
  io::uci::parsePosition(&local_30,&(this->super_UciTest).super_BoardTest.pos);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_94 = A3;
  local_98 = WP;
  std::pair<const_board::Square,_board::Piece>::pair<board::Square,_board::Piece,_true>
            (&local_90,&local_94,&local_98);
  local_80 = 1;
  local_88 = &local_90;
  std::allocator<std::pair<const_board::Square,_board::Piece>_>::allocator(&local_9a);
  __l_00._M_len = local_80;
  __l_00._M_array = local_88;
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::map(&local_78,__l_00,&local_99,&local_9a);
  test::BoardTest::ASSERT_BOARD
            ((BoardTest *)this,&(this->super_UciTest).super_BoardTest.pos,&local_78,BLACK,NO_SQ,0,
             0xf);
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::~map(&local_78);
  std::allocator<std::pair<const_board::Square,_board::Piece>_>::~allocator(&local_9a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"moves a7a6",&local_c1);
  io::uci::parsePosition(&local_c0,&(this->super_UciTest).super_BoardTest.pos);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_11c = A3;
  local_120 = WP;
  std::pair<const_board::Square,_board::Piece>::pair<board::Square,_board::Piece,_true>
            (&local_118,&local_11c,&local_120);
  local_124 = A6;
  local_128 = BP;
  std::pair<const_board::Square,_board::Piece>::pair<board::Square,_board::Piece,_true>
            (&local_110,&local_124,&local_128);
  local_100 = 2;
  local_108 = &local_118;
  std::allocator<std::pair<const_board::Square,_board::Piece>_>::allocator(&local_12a);
  __l._M_len = local_100;
  __l._M_array = local_108;
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::map(&local_f8,__l,&local_129,&local_12a);
  test::BoardTest::ASSERT_BOARD
            ((BoardTest *)this,&(this->super_UciTest).super_BoardTest.pos,&local_f8,WHITE,NO_SQ,0,
             0xf);
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::~map(&local_f8);
  std::allocator<std::pair<const_board::Square,_board::Piece>_>::~allocator(&local_12a);
  return;
}

Assistant:

TEST_F(UciTest, parseMovesA2A3A7A6)
{
    io::uci::parsePosition("moves a2a3", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                 },
                 board::BLACK, board::NO_SQ, 0);

    io::uci::parsePosition("moves a7a6", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                     {board::A6, board::BP},
                 },
                 board::WHITE, board::NO_SQ, 0);
}